

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_compute_imm_branch
               (DisasContext_conflict6 *ctx,uint32_t opc,int rt,int32_t imm,int32_t offset)

{
  TCGContext_conflict6 *tcg_ctx_00;
  bool bVar1;
  TCGCond cond_00;
  TCGv_i64 t;
  TCGv_i64 ret;
  target_ulong tVar2;
  TCGLabel *l;
  TCGLabel *fs;
  TCGv_i64 t1;
  TCGv_i64 t0;
  int bcond_compute;
  TCGCond cond;
  TCGContext_conflict6 *tcg_ctx;
  int32_t offset_local;
  int32_t imm_local;
  int rt_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  bVar1 = false;
  t = tcg_temp_new_i64(tcg_ctx_00);
  ret = tcg_temp_new_i64(tcg_ctx_00);
  gen_load_gpr(tcg_ctx_00,t,rt);
  tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret,(long)imm);
  tVar2 = addr_add(ctx,(ctx->base).pc_next + 4,(long)offset);
  ctx->btarget = tVar2;
  switch(opc) {
  case 0:
    if ((rt != 0) || (imm != 0)) {
      if ((rt == 0) && (imm != 0)) goto LAB_00d0dcc1;
      bVar1 = true;
      t0._4_4_ = TCG_COND_EQ;
    }
    break;
  case 1:
  case 5:
    check_nms(ctx);
    if ((0x1f < imm) && ((ctx->hflags & 8) == 0)) {
      generate_exception_end(ctx,0x14);
      goto LAB_00d0dcc1;
    }
    if ((rt != 0) || (opc != 1)) {
      if ((rt == 0) && (opc == 5)) goto LAB_00d0dcc1;
      tcg_gen_shri_i64_mips64el(tcg_ctx_00,t,t,(long)imm);
      tcg_gen_andi_i64_mips64el(tcg_ctx_00,t,t,1);
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret,0);
      bVar1 = true;
      if (opc == 1) {
        t0._4_4_ = TCG_COND_EQ;
      }
      else {
        t0._4_4_ = TCG_COND_NE;
      }
    }
    break;
  case 2:
    if ((rt != 0) || (imm != 0)) {
      bVar1 = true;
      t0._4_4_ = TCG_COND_GE;
    }
    break;
  case 3:
    if ((rt != 0) || (imm != 0)) {
      bVar1 = true;
      t0._4_4_ = TCG_COND_GEU;
    }
    break;
  case 4:
    if ((rt == 0) && (imm == 0)) goto LAB_00d0dcc1;
    if ((rt != 0) || (imm == 0)) {
      bVar1 = true;
      t0._4_4_ = TCG_COND_NE;
    }
    break;
  case 6:
    bVar1 = true;
    t0._4_4_ = TCG_COND_LT;
    break;
  case 7:
    bVar1 = true;
    t0._4_4_ = TCG_COND_LTU;
    break;
  default:
    generate_exception_end(ctx,0x14);
    goto LAB_00d0dcc1;
  }
  clear_branch_hflags(ctx);
  (ctx->base).is_jmp = DISAS_NORETURN;
  if (bVar1) {
    l = gen_new_label_mips64el(tcg_ctx_00);
    cond_00 = tcg_invert_cond(t0._4_4_);
    tcg_gen_brcond_i64_mips64el(tcg_ctx_00,cond_00,t,ret,l);
    gen_goto_tb(ctx,1,ctx->btarget);
    gen_set_label(tcg_ctx_00,l);
    gen_goto_tb(ctx,0,(ctx->base).pc_next + 4);
  }
  else {
    gen_goto_tb(ctx,0,ctx->btarget);
  }
LAB_00d0dcc1:
  tcg_temp_free_i64(tcg_ctx_00,t);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_compute_imm_branch(DisasContext *ctx, uint32_t opc,
                                   int rt, int32_t imm, int32_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGCond cond;
    int bcond_compute = 0;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t0, rt);
    tcg_gen_movi_tl(tcg_ctx, t1, imm);
    ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);

    /* Load needed operands and calculate btarget */
    switch (opc) {
    case NM_BEQIC:
        if (rt == 0 && imm == 0) {
            /* Unconditional branch */
        } else if (rt == 0 && imm != 0) {
            /* Treat as NOP */
            goto out;
        } else {
            bcond_compute = 1;
            cond = TCG_COND_EQ;
        }
        break;
    case NM_BBEQZC:
    case NM_BBNEZC:
        check_nms(ctx);
        if (imm >= 32 && !(ctx->hflags & MIPS_HFLAG_64)) {
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        } else if (rt == 0 && opc == NM_BBEQZC) {
            /* Unconditional branch */
        } else if (rt == 0 && opc == NM_BBNEZC) {
            /* Treat as NOP */
            goto out;
        } else {
            tcg_gen_shri_tl(tcg_ctx, t0, t0, imm);
            tcg_gen_andi_tl(tcg_ctx, t0, t0, 1);
            tcg_gen_movi_tl(tcg_ctx, t1, 0);
            bcond_compute = 1;
            if (opc == NM_BBEQZC) {
                cond = TCG_COND_EQ;
            } else {
                cond = TCG_COND_NE;
            }
        }
        break;
    case NM_BNEIC:
        if (rt == 0 && imm == 0) {
            /* Treat as NOP */
            goto out;
        } else if (rt == 0 && imm != 0) {
            /* Unconditional branch */
        } else {
            bcond_compute = 1;
            cond = TCG_COND_NE;
        }
        break;
    case NM_BGEIC:
        if (rt == 0 && imm == 0) {
            /* Unconditional branch */
        } else  {
            bcond_compute = 1;
            cond = TCG_COND_GE;
        }
        break;
    case NM_BLTIC:
        bcond_compute = 1;
        cond = TCG_COND_LT;
        break;
    case NM_BGEIUC:
        if (rt == 0 && imm == 0) {
            /* Unconditional branch */
        } else  {
            bcond_compute = 1;
            cond = TCG_COND_GEU;
        }
        break;
    case NM_BLTIUC:
        bcond_compute = 1;
        cond = TCG_COND_LTU;
        break;
    default:
        MIPS_INVAL("Immediate Value Compact branch");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    /* branch completion */
    clear_branch_hflags(ctx);
    ctx->base.is_jmp = DISAS_NORETURN;

    if (bcond_compute == 0) {
        /* Uncoditional compact branch */
        gen_goto_tb(ctx, 0, ctx->btarget);
    } else {
        /* Conditional compact branch */
        TCGLabel *fs = gen_new_label(tcg_ctx);

        tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(cond), t0, t1, fs);

        gen_goto_tb(ctx, 1, ctx->btarget);
        gen_set_label(tcg_ctx, fs);

        gen_goto_tb(ctx, 0, ctx->base.pc_next + 4);
    }

out:
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}